

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  uint *puVar5;
  ImGuiContext *pIVar6;
  ImGuiID IVar7;
  uint *__dest;
  int iVar8;
  int iVar9;
  ImGuiContext *ctx;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar2 = (pIVar4->IDStack).Size;
  if (str_id_end != (char *)0x0) {
    str_id_end = str_id_end + -(long)str_id_begin;
  }
  IVar7 = ImHashStr(str_id_begin,(size_t)str_id_end,(pIVar4->IDStack).Data[(long)iVar2 + -1]);
  iVar3 = (pIVar4->IDStack).Capacity;
  if (iVar2 == iVar3) {
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    iVar9 = iVar2 + 1;
    if (iVar2 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar3 < iVar9) {
      if (pIVar6 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
      puVar5 = (pIVar4->IDStack).Data;
      if (puVar5 != (uint *)0x0) {
        memcpy(__dest,puVar5,(long)(pIVar4->IDStack).Size << 2);
        puVar5 = (pIVar4->IDStack).Data;
        if ((puVar5 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar4->IDStack).Data = __dest;
      (pIVar4->IDStack).Capacity = iVar9;
    }
  }
  (pIVar4->IDStack).Data[(pIVar4->IDStack).Size] = IVar7;
  (pIVar4->IDStack).Size = (pIVar4->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}